

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O3

int __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::close
          (vertex_sequence<agg::vertex_dist,_6U> *this,int __fd)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  vertex_dist *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vertex_dist t;
  vertex_dist local_38;
  
  uVar4 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  while (1 < uVar4) {
    uVar6 = uVar4 - 2;
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    pvVar2 = ppvVar1[uVar6 >> 6];
    uVar5 = uVar6 & 0x3f;
    pvVar3 = ppvVar1[uVar4 - 1 >> 6];
    uVar7 = uVar4 - 1 & 0x3f;
    dVar8 = pvVar3[uVar7].x - pvVar2[uVar5].x;
    dVar9 = pvVar3[uVar7].y - pvVar2[uVar5].y;
    dVar8 = SQRT(dVar8 * dVar8 + dVar9 * dVar9);
    pvVar2[uVar5].dist =
         (double)(~-(ulong)(1e-14 < dVar8) & 0x42d6bcc41e900000 |
                 (ulong)dVar8 & -(ulong)(1e-14 < dVar8));
    if (1e-14 < dVar8) break;
    pvVar3 = pvVar3 + uVar7;
    local_38.dist = pvVar3->dist;
    local_38.x = pvVar3->x;
    local_38.y = pvVar3->y;
    (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar6;
    add(this,&local_38);
    uVar4 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  }
  if ((char)__fd == '\x01' && 1 < uVar4) {
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    pvVar3 = *ppvVar1;
    dVar8 = pvVar3->x;
    dVar9 = pvVar3->y;
    do {
      uVar4 = uVar4 - 1;
      pvVar3 = ppvVar1[uVar4 >> 6];
      uVar6 = uVar4 & 0x3f;
      dVar10 = dVar8 - pvVar3[uVar6].x;
      dVar11 = dVar9 - pvVar3[uVar6].y;
      dVar10 = SQRT(dVar10 * dVar10 + dVar11 * dVar11);
      pvVar3[uVar6].dist =
           (double)(~-(ulong)(1e-14 < dVar10) & 0x42d6bcc41e900000 |
                   (ulong)dVar10 & -(ulong)(1e-14 < dVar10));
      if (1e-14 < dVar10) {
        return uVar4;
      }
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar4;
    } while (1 < uVar4);
  }
  return uVar4;
}

Assistant:

void vertex_sequence<T, S>::close(bool closed)
    {
        while(base_type::size() > 1)
        {
            if((*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) break;
            T t = (*this)[base_type::size() - 1];
            base_type::remove_last();
            modify_last(t);
        }

        if(closed)
        {
            while(base_type::size() > 1)
            {
                if((*this)[base_type::size() - 1]((*this)[0])) break;
                base_type::remove_last();
            }
        }
    }